

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86IntelInstPrinter.c
# Opt level: O0

void X86_Intel_printInst(MCInst *MI,SStream *O,void *Info)

{
  long lVar1;
  _Bool _Var2;
  uint uVar3;
  x86_reg local_30;
  x86_reg local_2c;
  x86_reg reg2;
  x86_reg reg;
  char *mnem;
  void *Info_local;
  SStream *O_local;
  MCInst *MI_local;
  
  mnem = (char *)Info;
  Info_local = O;
  O_local = (SStream *)MI;
  _reg2 = printAliasInstr(MI,O,Info);
  if (_reg2 == (char *)0x0) {
    printInstruction((MCInst *)O_local,(SStream *)Info_local,(MCRegisterInfo *)mnem);
  }
  else {
    (*cs_mem_free)(_reg2);
  }
  uVar3 = MCInst_getOpcode((MCInst *)O_local);
  local_2c = X86_insn_reg_intel(uVar3);
  if (*(int *)(*(long *)(O_local[1].buffer + 0x11c) + 0x68) != 0) {
    if (local_2c == X86_REG_INVALID) {
      uVar3 = MCInst_getOpcode((MCInst *)O_local);
      _Var2 = X86_insn_reg_intel2(uVar3,&local_2c,&local_30);
      if (_Var2) {
        *(undefined4 *)(*(long *)(*(long *)(O_local[1].buffer + 0x10c) + 0xe8) + 0x60) = 1;
        *(x86_reg *)(*(long *)(*(long *)(O_local[1].buffer + 0x10c) + 0xe8) + 0x68) = local_2c;
        *(undefined1 *)(*(long *)(*(long *)(O_local[1].buffer + 0x10c) + 0xe8) + 0x80) =
             *(undefined1 *)
              (*(long *)(*(long *)(O_local[1].buffer + 0x11c) + 0xa8) + (ulong)local_2c);
        *(undefined4 *)(*(long *)(*(long *)(O_local[1].buffer + 0x10c) + 0xe8) + 0x90) = 1;
        *(x86_reg *)(*(long *)(*(long *)(O_local[1].buffer + 0x10c) + 0xe8) + 0x98) = local_30;
        *(undefined1 *)(*(long *)(*(long *)(O_local[1].buffer + 0x10c) + 0xe8) + 0xb0) =
             *(undefined1 *)
              (*(long *)(*(long *)(O_local[1].buffer + 0x11c) + 0xa8) + (ulong)local_30);
        *(undefined1 *)(*(long *)(*(long *)(O_local[1].buffer + 0x10c) + 0xe8) + 0x5c) = 2;
      }
    }
    else {
      memmove((void *)(*(long *)(*(long *)(O_local[1].buffer + 0x10c) + 0xe8) + 0x90),
              (void *)(*(long *)(*(long *)(O_local[1].buffer + 0x10c) + 0xe8) + 0x60),0x150);
      *(undefined4 *)(*(long *)(*(long *)(O_local[1].buffer + 0x10c) + 0xe8) + 0x60) = 1;
      *(x86_reg *)(*(long *)(*(long *)(O_local[1].buffer + 0x10c) + 0xe8) + 0x68) = local_2c;
      *(undefined1 *)(*(long *)(*(long *)(O_local[1].buffer + 0x10c) + 0xe8) + 0x80) =
           *(undefined1 *)(*(long *)(*(long *)(O_local[1].buffer + 0x11c) + 0xa8) + (ulong)local_2c)
      ;
      *(undefined1 *)(*(long *)(*(long *)(O_local[1].buffer + 0x10c) + 0xe8) + 0xb0) =
           *(undefined1 *)(*(long *)(*(long *)(O_local[1].buffer + 0x11c) + 0xa8) + (ulong)local_2c)
      ;
      lVar1 = *(long *)(*(long *)(O_local[1].buffer + 0x10c) + 0xe8);
      *(char *)(lVar1 + 0x5c) = *(char *)(lVar1 + 0x5c) + '\x01';
    }
  }
  if ((O_local->buffer[6] == '\0') && (local_2c != X86_REG_INVALID)) {
    O_local->buffer[6] =
         *(char *)(*(long *)(*(long *)(O_local[1].buffer + 0x11c) + 0xa8) + (ulong)local_2c);
  }
  return;
}

Assistant:

void X86_Intel_printInst(MCInst *MI, SStream *O, void *Info)
{
	char *mnem;
	x86_reg reg, reg2;

	// Try to print any aliases first.
	mnem = printAliasInstr(MI, O, Info);
	if (mnem)
		cs_mem_free(mnem);
	else
		printInstruction(MI, O, Info);

	reg = X86_insn_reg_intel(MCInst_getOpcode(MI));
	if (MI->csh->detail) {
		// first op can be embedded in the asm by llvm.
		// so we have to add the missing register as the first operand
		if (reg) {
			// shift all the ops right to leave 1st slot for this new register op
			memmove(&(MI->flat_insn->detail->x86.operands[1]), &(MI->flat_insn->detail->x86.operands[0]),
					sizeof(MI->flat_insn->detail->x86.operands[0]) * (ARR_SIZE(MI->flat_insn->detail->x86.operands) - 1));
			MI->flat_insn->detail->x86.operands[0].type = X86_OP_REG;
			MI->flat_insn->detail->x86.operands[0].reg = reg;
			MI->flat_insn->detail->x86.operands[0].size = MI->csh->regsize_map[reg];
			MI->flat_insn->detail->x86.operands[1].size = MI->csh->regsize_map[reg];
			MI->flat_insn->detail->x86.op_count++;
		} else {
			if (X86_insn_reg_intel2(MCInst_getOpcode(MI), &reg, &reg2)) {
				MI->flat_insn->detail->x86.operands[0].type = X86_OP_REG;
				MI->flat_insn->detail->x86.operands[0].reg = reg;
				MI->flat_insn->detail->x86.operands[0].size = MI->csh->regsize_map[reg];
				MI->flat_insn->detail->x86.operands[1].type = X86_OP_REG;
				MI->flat_insn->detail->x86.operands[1].reg = reg2;
				MI->flat_insn->detail->x86.operands[1].size = MI->csh->regsize_map[reg2];
				MI->flat_insn->detail->x86.op_count = 2;
			}
		}
	}

	if (MI->op1_size == 0 && reg)
		MI->op1_size = MI->csh->regsize_map[reg];
}